

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_hrec_set_val(bcf_hrec_t *hrec,int i,char *str,int len,int is_quoted)

{
  char *pcVar1;
  int is_quoted_local;
  int len_local;
  char *str_local;
  int i_local;
  bcf_hrec_t *hrec_local;
  
  if (str == (char *)0x0) {
    hrec->vals[i] = (char *)0x0;
  }
  else {
    if (hrec->vals[i] != (char *)0x0) {
      free(hrec->vals[i]);
    }
    if (is_quoted == 0) {
      pcVar1 = (char *)malloc((long)(len + 1));
      hrec->vals[i] = pcVar1;
      memcpy(hrec->vals[i],str,(long)len);
      hrec->vals[i][len] = '\0';
    }
    else {
      pcVar1 = (char *)malloc((long)(len + 3));
      hrec->vals[i] = pcVar1;
      *hrec->vals[i] = '\"';
      memcpy(hrec->vals[i] + 1,str,(long)len);
      hrec->vals[i][len + 1] = '\"';
      hrec->vals[i][len + 2] = '\0';
    }
  }
  return;
}

Assistant:

void bcf_hrec_set_val(bcf_hrec_t *hrec, int i, const char *str, int len, int is_quoted)
{
    if ( !str ) { hrec->vals[i] = NULL; return; }
    if ( hrec->vals[i] ) free(hrec->vals[i]);
    if ( is_quoted )
    {
        hrec->vals[i] = (char*) malloc((len+3)*sizeof(char));
        hrec->vals[i][0] = '"';
        memcpy(&hrec->vals[i][1],str,len);
        hrec->vals[i][len+1] = '"';
        hrec->vals[i][len+2] = 0;
    }
    else
    {
        hrec->vals[i] = (char*) malloc((len+1)*sizeof(char));
        memcpy(hrec->vals[i],str,len);
        hrec->vals[i][len] = 0;
    }
}